

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testapi.c
# Opt level: O0

int test_xmlNewInputFromFd(void)

{
  int iVar1;
  int iVar2;
  xmlParserInputFlags val;
  char *val_00;
  xmlParserInputPtr val_01;
  int local_34;
  int n_flags;
  xmlParserInputFlags flags;
  int n_fd;
  int fd;
  int n_url;
  char *url;
  xmlParserInputPtr ret_val;
  int mem_base;
  int test_ret;
  
  ret_val._4_4_ = 0;
  for (n_fd = 0; n_fd < 8; n_fd = n_fd + 1) {
    for (n_flags = 0; n_flags < 4; n_flags = n_flags + 1) {
      for (local_34 = 0; local_34 < 4; local_34 = local_34 + 1) {
        iVar1 = xmlMemBlocks();
        val_00 = gen_filepath(n_fd,0);
        iVar2 = gen_int(n_flags,1);
        val = gen_xmlParserInputFlags(local_34,2);
        val_01 = (xmlParserInputPtr)xmlNewInputFromFd(val_00,iVar2,val);
        desret_xmlParserInputPtr(val_01);
        call_tests = call_tests + 1;
        des_filepath(n_fd,val_00,0);
        des_int(n_flags,iVar2,1);
        des_xmlParserInputFlags(local_34,val,2);
        xmlResetLastError();
        iVar2 = xmlMemBlocks();
        if (iVar1 != iVar2) {
          iVar2 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlNewInputFromFd",(ulong)(uint)(iVar2 - iVar1));
          ret_val._4_4_ = ret_val._4_4_ + 1;
          printf(" %d",(ulong)(uint)n_fd);
          printf(" %d",(ulong)(uint)n_flags);
          printf(" %d");
          printf("\n");
        }
      }
    }
  }
  function_tests = function_tests + 1;
  return ret_val._4_4_;
}

Assistant:

static int
test_xmlNewInputFromFd(void) {
    int test_ret = 0;

    int mem_base;
    xmlParserInputPtr ret_val;
    const char * url; /* base URL (optional) */
    int n_url;
    int fd; /* file descriptor */
    int n_fd;
    xmlParserInputFlags flags; /* input flags */
    int n_flags;

    for (n_url = 0;n_url < gen_nb_filepath;n_url++) {
    for (n_fd = 0;n_fd < gen_nb_int;n_fd++) {
    for (n_flags = 0;n_flags < gen_nb_xmlParserInputFlags;n_flags++) {
        mem_base = xmlMemBlocks();
        url = gen_filepath(n_url, 0);
        fd = gen_int(n_fd, 1);
        flags = gen_xmlParserInputFlags(n_flags, 2);

        ret_val = xmlNewInputFromFd(url, fd, flags);
        desret_xmlParserInputPtr(ret_val);
        call_tests++;
        des_filepath(n_url, url, 0);
        des_int(n_fd, fd, 1);
        des_xmlParserInputFlags(n_flags, flags, 2);
        xmlResetLastError();
        if (mem_base != xmlMemBlocks()) {
            printf("Leak of %d blocks found in xmlNewInputFromFd",
	           xmlMemBlocks() - mem_base);
	    test_ret++;
            printf(" %d", n_url);
            printf(" %d", n_fd);
            printf(" %d", n_flags);
            printf("\n");
        }
    }
    }
    }
    function_tests++;

    return(test_ret);
}